

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

VectorSet * __thiscall
TreeIncPruneBGPlanner::PruneAfterUnion
          (VectorSet *__return_storage_ptr__,TreeIncPruneBGPlanner *this,Index depth,VectorSet *G)

{
  AlphaVectorPlanning::Prune(__return_storage_ptr__,(AlphaVectorPlanning *)this,G);
  return __return_storage_ptr__;
}

Assistant:

VectorSet TreeIncPruneBGPlanner::PruneAfterUnion(Index depth,
                                                 const VectorSet &G)
{
    VectorSet G1=Prune(G);
#if DEBUG_TreeIncPruneBGPlanner_KeepPruneStats
    vector<size_t> pruneStat(3);
    pruneStat[0]=depth;
    pruneStat[1]=G.size1();
    pruneStat[2]=G1.size1();
    _m_pruneAfterUnionStats.push_back(pruneStat);
#endif
    return(G1);
}